

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.cpp
# Opt level: O0

Type * __thiscall
slang::ast::SystemSubroutine::badArg(SystemSubroutine *this,ASTContext *context,Expression *arg)

{
  string_view arg_00;
  Compilation *this_00;
  Type *pTVar1;
  long in_RDX;
  Diagnostic *in_RSI;
  Type *in_RDI;
  Diagnostic *unaff_retaddr;
  undefined8 local_40;
  
  ASTContext::addDiag(local_40,(DiagCode)0x5000b,*(SourceRange *)(in_RDX + 0x20));
  not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xa8bdd8);
  ast::operator<<(unaff_retaddr,in_RDI);
  kindStr((SystemSubroutine *)0xa8bdf3);
  arg_00._M_str = (char *)unaff_retaddr;
  arg_00._M_len = (size_t)in_RDI;
  Diagnostic::operator<<(in_RSI,arg_00);
  this_00 = ASTContext::getCompilation((ASTContext *)0xa8be1b);
  pTVar1 = Compilation::getErrorType(this_00);
  return pTVar1;
}

Assistant:

const Type& SystemSubroutine::badArg(const ASTContext& context, const Expression& arg) const {
    context.addDiag(diag::BadSystemSubroutineArg, arg.sourceRange) << *arg.type << kindStr();
    return context.getCompilation().getErrorType();
}